

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.hh
# Opt level: O2

void phosg::parallel_range_blocks_thread_fn<unsigned_long>
               (function<bool_(unsigned_long,_unsigned_long)> *fn,
               atomic<unsigned_long> *current_value,atomic<unsigned_long> *result_value,
               unsigned_long end_value,unsigned_long block_size,size_t thread_num)

{
  ulong uVar1;
  bool bVar2;
  ulong __args;
  
  do {
    LOCK();
    __args = (current_value->super___atomic_base<unsigned_long>)._M_i;
    (current_value->super___atomic_base<unsigned_long>)._M_i =
         (current_value->super___atomic_base<unsigned_long>)._M_i + block_size;
    UNLOCK();
    if (end_value <= __args) {
      return;
    }
    uVar1 = __args + block_size;
    for (; __args < uVar1; __args = __args + 1) {
      bVar2 = ::std::function<bool_(unsigned_long,_unsigned_long)>::operator()(fn,__args,thread_num)
      ;
      if (bVar2) {
        LOCK();
        (result_value->super___atomic_base<unsigned_long>)._M_i = __args;
        UNLOCK();
        LOCK();
        (current_value->super___atomic_base<unsigned_long>)._M_i = end_value;
        UNLOCK();
        break;
      }
    }
  } while( true );
}

Assistant:

void parallel_range_blocks_thread_fn(
    std::function<bool(IntT, size_t thread_num)>& fn,
    std::atomic<IntT>& current_value,
    std::atomic<IntT>& result_value,
    IntT end_value,
    IntT block_size,
    size_t thread_num) {
  IntT block_start;
  while ((block_start = current_value.fetch_add(block_size)) < end_value) {
    IntT block_end = block_start + block_size;
    for (IntT z = block_start; z < block_end; z++) {
      if (fn(z, thread_num)) {
        result_value = z;
        current_value = end_value;
        break;
      }
    }
  }
}